

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds2.cpp
# Opt level: O2

bool ReadDS2(MemFile *file,shared_ptr<Disk> *disk)

{
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var1;
  char extraout_AL;
  bool bVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  Data *pDVar6;
  exception *this;
  FILE *__stream;
  allocator<char> local_109;
  Data data;
  string path;
  MemFile file2;
  Format fmt;
  
  psVar5 = MemFile::path_abi_cxx11_(file);
  std::__cxx11::string::string((string *)&path,(string *)psVar5);
  file2.m_path._M_dataplus._M_p = (pointer)&file2.m_path.field_2;
  file2.m_path._M_string_length = 0;
  file2.m_path.field_2._M_local_buf[0] = '\0';
  file2.m_filename._M_dataplus._M_p = (pointer)&file2.m_filename.field_2;
  file2.m_filename._M_string_length = 0;
  file2.m_filename.field_2._M_local_buf[0] = '\0';
  file2.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  file2.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  file2.m_data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  file2.m_it._M_current = (uchar *)0x0;
  file2.m_compress = None;
  __stream = (FILE *)0x0;
  Format::Format(&fmt,MGT);
  MemFile::rewind(file,__stream);
  if (extraout_AL != '\0') {
    iVar3 = MemFile::size(file);
    iVar4 = Format::disk_size(&fmt);
    if (iVar3 == iVar4 / 2) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&data,"dsk",&local_109);
      bVar2 = IsFileExt(&path,(string *)&data);
      std::__cxx11::string::~string((string *)&data);
      if (bVar2) {
        path._M_dataplus._M_p[path._M_string_length - 1] = '2';
        MemFile::open(&file2,(char *)&path,1);
        iVar3 = MemFile::size(&file2);
        iVar4 = Format::disk_size(&fmt);
        if (iVar3 != iVar4 / 2) {
          this = (exception *)__cxa_allocate_exception(0x10);
          util::exception::exception<std::__cxx11::string&,char_const(&)[24]>
                    (this,&path,(char (*) [24])" file size is incorrect");
          __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        pDVar6 = MemFile::data(file);
        _Var1._M_current =
             (pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pDVar6 = MemFile::data(file);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,_Var1,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish,(allocator_type *)&local_109);
        pDVar6 = MemFile::data(&file2);
        _Var1._M_current =
             (pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        pDVar6 = MemFile::data(&file2);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&data,
                   (const_iterator)
                   data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish,_Var1,
                   (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )(pDVar6->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
        Disk::format((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,&fmt,&data,
                     true);
        std::__cxx11::string::assign
                  ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                            strType);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
        bVar2 = true;
        goto LAB_0018c549;
      }
    }
  }
  bVar2 = false;
LAB_0018c549:
  MemFile::~MemFile(&file2);
  std::__cxx11::string::~string((string *)&path);
  return bVar2;
}

Assistant:

bool ReadDS2(MemFile& file, std::shared_ptr<Disk>& disk)
{
    std::string path = file.path();
    MemFile file2;

    Format fmt{ RegularFormat::MGT };

    // The input should be half a standard SAM disk in size
    if (!file.rewind() || file.size() != fmt.disk_size() / 2)
        return false;

    // Require the supplied file be head 0
    if (!IsFileExt(path, "dsk"))
        return false;

    // DSK->DS2
    size_t offset = path.length() - 1;
    path[offset] = '2';

    // The DS2 file must also be present
    try {
        file2.open(path);
    }
    catch (...) {
        return false;
    }

    // The companion file should also contain a single side
    if (file2.size() != fmt.disk_size() / 2)
        throw util::exception(path, " file size is incorrect");

    // Join the sides
    Data data(file.data().begin(), file.data().end());
    data.insert(data.end(), file2.data().begin(), file2.data().end());

    disk->format(fmt, data, true);
    disk->strType = "DS2";

    return true;
}